

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O3

void __thiscall Assimp::FlipUVsProcess::ProcessMesh(FlipUVsProcess *this,aiMesh *pMesh)

{
  aiAnimMesh *paVar1;
  long lVar2;
  ulong uVar3;
  uint tcIdx;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  if (pMesh != (aiMesh *)0x0) {
    uVar3 = (ulong)pMesh->mNumVertices;
    lVar2 = 0;
    do {
      if ((pMesh->mTextureCoords[lVar2] == (aiVector3D *)0x0) || ((int)uVar3 == 0)) break;
      lVar5 = 4;
      uVar6 = 0;
      do {
        *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar5) =
             1.0 - *(float *)((long)&pMesh->mTextureCoords[lVar2]->x + lVar5);
        uVar6 = uVar6 + 1;
        uVar3 = (ulong)pMesh->mNumVertices;
        lVar5 = lVar5 + 0xc;
      } while (uVar6 < uVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  uVar4 = pMesh->mNumAnimMeshes;
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      paVar1 = pMesh->mAnimMeshes[uVar3];
      if (paVar1 != (aiAnimMesh *)0x0) {
        lVar2 = 0;
        do {
          if (paVar1->mTextureCoords[lVar2] == (aiVector3D *)0x0) break;
          if (paVar1->mNumVertices != 0) {
            lVar5 = 4;
            uVar6 = 0;
            do {
              *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar5) =
                   1.0 - *(float *)((long)&paVar1->mTextureCoords[lVar2]->x + lVar5);
              uVar6 = uVar6 + 1;
              lVar5 = lVar5 + 0xc;
            } while (uVar6 < paVar1->mNumVertices);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        uVar4 = pMesh->mNumAnimMeshes;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar4);
  }
  return;
}

Assistant:

void flipUVs(aiMeshType* pMesh) {
    if (pMesh == nullptr) { return; }
    // mirror texture y coordinate
    for (unsigned int tcIdx = 0; tcIdx < AI_MAX_NUMBER_OF_TEXTURECOORDS; tcIdx++) {
        if (!pMesh->HasTextureCoords(tcIdx)) {
            break;
        }

        for (unsigned int vIdx = 0; vIdx < pMesh->mNumVertices; vIdx++) {
            pMesh->mTextureCoords[tcIdx][vIdx].y = 1.0f - pMesh->mTextureCoords[tcIdx][vIdx].y;
        }
    }
}